

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O3

int __thiscall mpt::pipe<int>::~pipe(pipe<int> *this,int *__pipedes)

{
  instance *piVar1;
  long in_RAX;
  uint8_t buf [4];
  undefined1 local_14 [4];
  
  do {
    piVar1 = (this->_d)._ref;
    if (piVar1 == (instance *)0x0) goto LAB_00102939;
    in_RAX = (**(code **)(*(long *)&piVar1->super_type + 0x50))(piVar1,local_14,4);
  } while ((char)in_RAX != '\0');
  piVar1 = (this->_d)._ref;
  if (piVar1 != (instance *)0x0) {
    in_RAX = mpt::refcount::lower();
    if (in_RAX == 0) {
      in_RAX = (**(code **)(*(long *)&piVar1->super_type + 0x38))(piVar1);
    }
  }
LAB_00102939:
  return (int)in_RAX;
}

Assistant:

~pipe()
	{
		while (pop());
	}